

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Map(Map *this)

{
  int iVar1;
  Player *this_00;
  SimplePlayerController *this_01;
  Player *plyr;
  time_t tVar2;
  int local_34;
  int i;
  int times;
  Point<double> local_20;
  Map *local_10;
  Map *this_local;
  
  local_10 = this;
  std::vector<Scene_*,_std::allocator<Scene_*>_>::vector(&this->scenes);
  Point<double>::Point(&local_20,0.0,0.0);
  Positioned<Player>::Positioned(&this->player,local_20);
  std::operator<<((ostream *)&std::cout,"Map initialized\n");
  this_00 = Positioned<Player>::get(&this->player);
  this_01 = (SimplePlayerController *)operator_new(0x10);
  plyr = Positioned<Player>::get(&this->player);
  SimplePlayerController::SimplePlayerController(this_01,plyr);
  Player::setController(this_00,(PlayerController *)this_01);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  iVar1 = rand();
  for (local_34 = 0; local_34 < iVar1 % 8 + 7; local_34 = local_34 + 1) {
    generateScene(this);
  }
  return;
}

Assistant:

Map::Map() : player({0, 0}) {
    std::cout << "Map initialized\n";
    player.get().setController(new SimplePlayerController(&player.get()));
    srand((unsigned) time(nullptr));
    int times = rand() % 8 + 7;
    for (int i = 0; i < times; ++i) {
        generateScene();
    }
}